

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Track::Track(Track *this,uint *seed)

{
  uint64 uVar1;
  
  this->_vptr_Track = (_func_int **)&PTR__AudioTrack_0013f9b8;
  this->codec_id_ = (char *)0x0;
  this->codec_private_ = (uint8_t *)0x0;
  this->language_ = (char *)0x0;
  this->max_block_additional_id_ = 0;
  this->name_ = (char *)0x0;
  this->number_ = 0;
  this->type_ = 0;
  uVar1 = MakeUID(seed);
  this->uid_ = uVar1;
  this->codec_delay_ = 0;
  this->seek_pre_roll_ = 0;
  this->default_duration_ = 0;
  this->codec_private_length_ = 0;
  *(undefined8 *)((long)&this->codec_private_length_ + 4) = 0;
  *(undefined8 *)((long)&this->content_encoding_entries_ + 4) = 0;
  return;
}

Assistant:

Track::Track(unsigned int* seed)
    : codec_id_(NULL),
      codec_private_(NULL),
      language_(NULL),
      max_block_additional_id_(0),
      name_(NULL),
      number_(0),
      type_(0),
      uid_(MakeUID(seed)),
      codec_delay_(0),
      seek_pre_roll_(0),
      default_duration_(0),
      codec_private_length_(0),
      content_encoding_entries_(NULL),
      content_encoding_entries_size_(0) {}